

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::timerEvent(QTableView *this,QTimerEvent *event)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  QWidget *this_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  QScrollBar *pQVar12;
  uint uVar13;
  long in_FS_OFFSET;
  Representation RVar14;
  Representation RVar15;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar7 = *(int *)(event + 0x10);
  if (iVar7 != *(int *)(lVar4 + 0x548)) goto LAB_0052e957;
  pQVar12 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  iVar7 = QAbstractSlider::maximum(&pQVar12->super_QAbstractSlider);
  lVar5 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget;
  if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580) + 8) + 0x540) == 1) {
    (**(code **)(lVar5 + 0x260))(this);
  }
  else {
    (**(code **)(lVar5 + 0x268))(this);
    QBasicTimer::stop();
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  lVar5 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
  uVar1 = *(undefined8 *)(lVar5 + 0x1c);
  uVar2 = *(undefined8 *)(lVar5 + 0x14);
  RVar14.m_i = (int)uVar1 - (int)uVar2;
  RVar15.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
  if (*(long *)(lVar4 + 0x650) == lVar4 + 0x650) {
    pQVar12 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar8 = QAbstractSlider::value(&pQVar12->super_QAbstractSlider);
    if (iVar8 == iVar7) goto LAB_0052e90c;
    uVar13 = *(uint *)(lVar4 + 0x560);
    while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
      iVar7 = *(int *)(*(long *)(lVar4 + 0x558) + (ulong)(uVar13 & 0x7fffffff) * 4);
      uVar11 = columnViewportPosition(this,iVar7);
      bVar6 = QWidget::isRightToLeft((QWidget *)this);
      if (bVar6) {
        iVar7 = columnWidth(this,iVar7);
        local_58.x1.m_i = 0;
        local_58.y1.m_i = 0;
        local_58.x2.m_i = iVar7 + uVar11 + -1;
      }
      else {
        local_58.y1.m_i = 0;
        local_58.x1.m_i = uVar11;
        local_58.x2.m_i = RVar14.m_i;
      }
      local_58.y2.m_i = RVar15.m_i;
      QRect::operator|=(&local_48,&local_58);
    }
  }
  else {
LAB_0052e90c:
    local_48.y2.m_i = RVar15.m_i;
    local_48.x2.m_i = RVar14.m_i;
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
  }
  this_00 = *(QWidget **)(lVar4 + 0x2b0);
  local_58 = (QRect)QRect::normalized();
  QWidget::update(this_00,&local_58);
  QList<int>::clear((QList<int> *)(lVar4 + 0x550));
  iVar7 = *(int *)(event + 0x10);
LAB_0052e957:
  if (iVar7 == *(int *)(lVar4 + 0x54c)) {
    pQVar12 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar7 = QAbstractSlider::maximum(&pQVar12->super_QAbstractSlider);
    lVar5 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget;
    if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                               field_0x8 + 0x588) + 8) + 0x540) == 1) {
      (**(code **)(lVar5 + 0x260))(this);
    }
    else {
      (**(code **)(lVar5 + 0x268))(this);
      QBasicTimer::stop();
    }
    lVar5 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
    RVar14.m_i = *(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18);
    iVar8 = *(int *)(lVar5 + 0x14);
    iVar3 = *(int *)(lVar5 + 0x1c);
    uVar13 = 0;
    if (*(long *)(lVar4 + 0x650) == lVar4 + 0x650) {
      pQVar12 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar9 = QAbstractSlider::value(&pQVar12->super_QAbstractSlider);
      uVar13 = 0;
      if (iVar9 != iVar7) {
        uVar11 = *(uint *)(lVar4 + 0x578);
        uVar13 = RVar14.m_i + 1;
        while (uVar11 = uVar11 - 1, -1 < (int)uVar11) {
          uVar10 = rowViewportPosition(this,*(int *)(*(long *)(lVar4 + 0x570) +
                                                    (ulong)(uVar11 & 0x7fffffff) * 4));
          if ((int)uVar10 <= (int)uVar13) {
            uVar13 = uVar10;
          }
        }
      }
    }
    local_48._0_8_ = (ulong)uVar13 << 0x20;
    local_48.y2.m_i = RVar14.m_i;
    local_48.x2.m_i = iVar3 - iVar8;
    QWidget::update(*(QWidget **)(lVar4 + 0x2b0),&local_48);
    QList<int>::clear((QList<int> *)(lVar4 + 0x568));
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::timerEvent(QTimerEvent *event)
{
    Q_D(QTableView);

    if (event->id() == d->columnResizeTimer.id()) {
        const int oldScrollMax = horizontalScrollBar()->maximum();
        if (horizontalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->columnResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        if (d->hasSpans() || horizontalScrollBar()->value() == oldScrollMax) {
            rect = QRect(0, 0, viewportWidth, viewportHeight);
        } else {
            for (int i = d->columnsToUpdate.size()-1; i >= 0; --i) {
                int column = d->columnsToUpdate.at(i);
                int x = columnViewportPosition(column);
                if (isRightToLeft())
                    rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
                else
                    rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
            }
        }

        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    }

    if (event->id() == d->rowResizeTimer.id()) {
        const int oldScrollMax = verticalScrollBar()->maximum();
        if (verticalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->rowResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        int top;
        if (d->hasSpans() || verticalScrollBar()->value() == oldScrollMax) {
            top = 0;
        } else {
            top = viewportHeight;
            for (int i = d->rowsToUpdate.size()-1; i >= 0; --i) {
                int y = rowViewportPosition(d->rowsToUpdate.at(i));
                top = qMin(top, y);
            }
        }

        d->viewport->update(QRect(0, top, viewportWidth, viewportHeight - top));
        d->rowsToUpdate.clear();
    }

    QAbstractItemView::timerEvent(event);
}